

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O3

string * module_for_header(string *__return_storage_ptr__,string *header)

{
  long *plVar1;
  int iVar2;
  iterator iVar3;
  string *extraout_RAX;
  _Base_ptr p_Var4;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long lVar5;
  bool bVar6;
  string module;
  long *local_98;
  long local_90;
  long local_88 [2];
  string *local_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&s_header_map_abi_cxx11_._M_t,header);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &s_header_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)(iVar3._M_node + 2),
               (long)&(iVar3._M_node[2]._M_parent)->_M_color + *(long *)(iVar3._M_node + 2));
    return extraout_RAX;
  }
  std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
  iVar2 = std::__cxx11::string::compare((char *)&local_98);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (iVar2 != 0) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (iVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return (string *)&__return_storage_ptr__->field_2;
    }
  }
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::substr((ulong)&local_98,(ulong)header);
  std::__cxx11::string::operator=((string *)header,(string *)&local_98);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((_Rb_tree_header *)s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var4 = s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,*(long *)(p_Var4 + 1),
                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
      if (local_90 != 0) {
        lVar5 = 0;
        do {
          if (*(char *)((long)local_98 + lVar5) == '~') {
            *(undefined1 *)((long)local_98 + lVar5) = 0x2f;
          }
          lVar5 = lVar5 + 1;
        } while (local_90 != lVar5);
      }
      std::__cxx11::string::substr((ulong)&local_50,(ulong)header);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_98,local_90 + (long)local_98);
      std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
      plVar1 = local_70;
      if (local_48 == local_68) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_50,local_70,local_48);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (plVar1 != local_60) {
        operator_delete(plVar1,local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (bVar6) {
        (local_78->_M_dataplus)._M_p = (pointer)&local_78->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,*(long *)(p_Var4 + 1),
                   (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
        if (local_98 == local_88) {
          return extraout_RAX_00;
        }
        operator_delete(local_98,local_88[0] + 1);
        return extraout_RAX_01;
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &s_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  (local_78->_M_dataplus)._M_p = (pointer)&local_78->field_2;
  local_78->_M_string_length = 0;
  (local_78->field_2)._M_local_buf[0] = '\0';
  return (string *)&local_78->field_2;
}

Assistant:

static std::string module_for_header( std::string header )
{
    {
        std::map<std::string, std::string>::const_iterator i = s_header_map.find( header );

        if( i != s_header_map.end() )
        {
            return i->second;
        }
    }

    if( header.substr( 0, 5 ) == "libs/" )
    {
        header = header.substr( 5 );
    }
    else if( header.substr( 0, 5 ) == "test/" )
    {
        header = header.substr( 5 );
    }
    else
    {
        return std::string();
    }

    for( std::set<std::string>::const_iterator i = s_modules.begin(); i != s_modules.end(); ++i )
    {
        std::string module = *i;
        std::replace( module.begin(), module.end(), '~', '/' );

        if( header.substr( 0, module.size() + 1 ) == module + '/' )
        {
            return *i;
        }
    }

    return std::string();
}